

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::CWallet::SetupDescriptorScriptPubKeyMans(CWallet *this)

{
  WalletDatabase *pWVar1;
  pointer pUVar2;
  uint256 id_00;
  pointer puVar3;
  bool bVar4;
  OutputType type;
  UniValue *pUVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  uint extraout_var;
  DescriptorScriptPubKeyMan *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  runtime_error *prVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  long lVar11;
  pointer pUVar12;
  pointer *__ptr;
  long in_FS_OFFSET;
  Span<const_std::byte> seed_00;
  string_view key;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  WalletBatch batch;
  uint256 id;
  CPubKey seed;
  string desc_error;
  CKey seed_key;
  CExtKey master_key;
  DescriptorScriptPubKeyMan *local_328;
  Descriptor *local_320;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_318;
  WalletBatch local_300;
  undefined2 local_2ea;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  uint256 local_248;
  FlatSigningProvider local_228;
  string local_130;
  undefined1 local_110 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<UniValue,_std::allocator<UniValue>_> local_d0;
  undefined1 local_b8 [64];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x23 & 1) == 0) {
    GenerateRandomKey(SUB81((CKey *)local_110,0));
    CKey::GetPubKey((CPubKey *)&local_228,(CKey *)local_110);
    bVar4 = CKey::VerifyPubKey((CKey *)local_110,(CPubKey *)&local_228);
    if (!bVar4) {
      __assert_fail("seed_key.VerifyPubKey(seed)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xead,"void wallet::CWallet::SetupDescriptorScriptPubKeyMans()");
    }
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    local_b8[0x28] = '\0';
    local_b8[0x29] = '\0';
    local_b8[0x2a] = '\0';
    local_b8[0x2b] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x30] = false;
    local_b8._56_8_ =
         (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
    seed_00.m_size._0_4_ =
         (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_head_impl !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) << 5;
    seed_00.m_data = (local_108._M_head_impl)->_M_elems;
    seed_00.m_size._4_4_ = 0;
    CExtKey::SetSeed((CExtKey *)local_b8,seed_00);
    SetupDescriptorScriptPubKeyMans(this,(CExtKey *)local_b8);
    if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )local_b8._56_8_ != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_b8 + 0x38),
                 (array<unsigned_char,_32UL> *)local_b8._56_8_);
    }
    if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )local_108._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0)
    {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_108,
                 local_108._M_head_impl);
    }
LAB_00c44bf6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    ExternalSignerScriptPubKeyMan::GetExternalSigner();
    ExternalSigner::GetDescriptors((UniValue *)local_110,(ExternalSigner *)local_b8,0);
    if (local_110._0_4_ != VOBJ) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"SetupDescriptorScriptPubKeyMans","");
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_130,": Unexpected result");
      local_228.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)(pbVar7->_M_dataplus)._M_p;
      paVar9 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.super_SigningProvider._vptr_SigningProvider == paVar9) {
        local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             paVar9->_M_allocated_capacity;
        local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)((long)&pbVar7->field_2 + 8);
        local_228.super_SigningProvider._vptr_SigningProvider =
             (_func_int **)&local_228.scripts._M_t._M_impl.super__Rb_tree_header;
      }
      else {
        local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             paVar9->_M_allocated_capacity;
      }
      local_228.scripts._M_t._M_impl._0_8_ = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar8,(string *)&local_228);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00c4542a;
    }
    pWVar1 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar1 == (WalletDatabase *)0x0) {
      __assert_fail("static_cast<bool>(m_database)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
    }
    (*pWVar1->_vptr_WalletDatabase[0xe])(&local_300,pWVar1,1);
    local_300.m_database = pWVar1;
    bVar4 = WalletBatch::TxnBegin(&local_300);
    if (bVar4) {
      local_2ea = 0x100;
      lVar11 = 0;
      do {
        bVar4 = *(bool *)((long)&local_2ea + lVar11);
        pcVar10 = "receive";
        if ((ulong)bVar4 != 0) {
          pcVar10 = "internal";
        }
        key._M_str = pcVar10;
        key._M_len = (ulong)bVar4 + 7;
        pUVar5 = ::UniValue::find_value((UniValue *)local_110,key);
        if (pUVar5->typ != VARR) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"SetupDescriptorScriptPubKeyMans","");
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_130,": Unexpected result");
          local_228.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)(pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.super_SigningProvider._vptr_SigningProvider == paVar9) {
            local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar9->_M_allocated_capacity;
            local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 *(_Base_ptr *)((long)&pbVar7->field_2 + 8);
            local_228.super_SigningProvider._vptr_SigningProvider =
                 (_func_int **)&local_228.scripts._M_t._M_impl.super__Rb_tree_header;
          }
          else {
            local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 paVar9->_M_allocated_capacity;
          }
          local_228.scripts._M_t._M_impl._0_8_ = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar8,(string *)&local_228);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00c4542a;
        }
        pUVar5 = ::UniValue::get_array(pUVar5);
        pvVar6 = ::UniValue::getValues(pUVar5);
        pUVar2 = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pUVar12 = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                       super__Vector_impl_data._M_start; pUVar12 != pUVar2; pUVar12 = pUVar12 + 1) {
          local_228.super_SigningProvider._vptr_SigningProvider =
               (_func_int **)&PTR__FlatSigningProvider_013e4da8;
          local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
          local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
               0xffffffff00000000;
          local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_228.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_228.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_228.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_228.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
          local_228.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_228.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_228.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_228.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_228.origins._M_t._M_impl.super__Rb_tree_header._M_header;
          local_228.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_228.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_228.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_228.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_228.keys._M_t._M_impl.super__Rb_tree_header._M_header;
          local_228.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_228.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_228.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          local_228.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_228.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
          local_228.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          local_130._M_string_length = 0;
          local_130.field_2._M_local_buf[0] = '\0';
          local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_228.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_228.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_228.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_228.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_228.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_228.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_228.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_228.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_228.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Parse(&local_318,&pUVar12->val,&local_228,&local_130,false);
          puVar3 = local_318.
                   super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_318.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_318.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2e8,"SetupDescriptorScriptPubKeyMans","");
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_2e8,": Invalid descriptor \"");
            local_2c8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar9 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p == paVar9) {
              local_2c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_2c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            }
            else {
              local_2c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_2c8._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::operator+(&local_2a8,&local_2c8,&pUVar12->val);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_2a8,"\" (");
            local_288._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar9 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p == paVar9) {
              local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            }
            else {
              local_288.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_288._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::operator+(&local_268,&local_288,&local_130);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_268,")");
            local_248.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar7->_M_dataplus)._M_p;
            paVar9 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248.super_base_blob<256U>.m_data._M_elems._0_8_ == paVar9) {
              local_248.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar9->_M_allocated_capacity
              ;
              local_248.super_base_blob<256U>.m_data._M_elems._24_8_ =
                   *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_248.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   local_248.super_base_blob<256U>.m_data._M_elems + 0x10;
            }
            else {
              local_248.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar9->_M_allocated_capacity
              ;
            }
            local_248.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(prVar8,(string *)&local_248);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00c4542a;
          }
          (*(((local_318.
               super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
             super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
             super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl)->_vptr_Descriptor[0xb])();
          if ((extraout_var & 1) != 0) {
            type = (*((puVar3->_M_t).
                      super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                      super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                      super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl)->_vptr_Descriptor
                     [0xb])();
            this_00 = (DescriptorScriptPubKeyMan *)operator_new(0x278);
            DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
                      (this_00,&this->super_WalletStorage,this->m_keypool_size);
            (this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan =
                 (_func_int **)&PTR__DescriptorScriptPubKeyMan_013e1be8;
            local_320 = (puVar3->_M_t).
                        super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                        super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                        super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
            (puVar3->_M_t).super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
            super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
            super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl = (Descriptor *)0x0;
            ExternalSignerScriptPubKeyMan::SetupDescriptor
                      ((ExternalSignerScriptPubKeyMan *)this_00,&local_300,
                       (unique_ptr<Descriptor,_std::default_delete<Descriptor>_>)&local_320);
            if (local_320 != (Descriptor *)0x0) {
              (*local_320->_vptr_Descriptor[1])();
            }
            local_320 = (Descriptor *)0x0;
            (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_248,this_00);
            local_328 = this_00;
            AddScriptPubKeyMan(this,&local_248,
                               (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                                )&local_328);
            if (local_328 != (DescriptorScriptPubKeyMan *)0x0) {
              (*(local_328->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[1])();
            }
            local_328 = (DescriptorScriptPubKeyMan *)0x0;
            id_00.super_base_blob<256U>.m_data._M_elems[8] =
                 local_248.super_base_blob<256U>.m_data._M_elems[8];
            id_00.super_base_blob<256U>.m_data._M_elems[9] =
                 local_248.super_base_blob<256U>.m_data._M_elems[9];
            id_00.super_base_blob<256U>.m_data._M_elems[10] =
                 local_248.super_base_blob<256U>.m_data._M_elems[10];
            id_00.super_base_blob<256U>.m_data._M_elems[0xb] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0xb];
            id_00.super_base_blob<256U>.m_data._M_elems[0xc] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0xc];
            id_00.super_base_blob<256U>.m_data._M_elems[0xd] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0xd];
            id_00.super_base_blob<256U>.m_data._M_elems[0xe] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0xe];
            id_00.super_base_blob<256U>.m_data._M_elems[0xf] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0xf];
            id_00.super_base_blob<256U>.m_data._M_elems[0] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0];
            id_00.super_base_blob<256U>.m_data._M_elems[1] =
                 local_248.super_base_blob<256U>.m_data._M_elems[1];
            id_00.super_base_blob<256U>.m_data._M_elems[2] =
                 local_248.super_base_blob<256U>.m_data._M_elems[2];
            id_00.super_base_blob<256U>.m_data._M_elems[3] =
                 local_248.super_base_blob<256U>.m_data._M_elems[3];
            id_00.super_base_blob<256U>.m_data._M_elems[4] =
                 local_248.super_base_blob<256U>.m_data._M_elems[4];
            id_00.super_base_blob<256U>.m_data._M_elems[5] =
                 local_248.super_base_blob<256U>.m_data._M_elems[5];
            id_00.super_base_blob<256U>.m_data._M_elems[6] =
                 local_248.super_base_blob<256U>.m_data._M_elems[6];
            id_00.super_base_blob<256U>.m_data._M_elems[7] =
                 local_248.super_base_blob<256U>.m_data._M_elems[7];
            id_00.super_base_blob<256U>.m_data._M_elems[0x10] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x10];
            id_00.super_base_blob<256U>.m_data._M_elems[0x11] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x11];
            id_00.super_base_blob<256U>.m_data._M_elems[0x12] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x12];
            id_00.super_base_blob<256U>.m_data._M_elems[0x13] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x13];
            id_00.super_base_blob<256U>.m_data._M_elems[0x14] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x14];
            id_00.super_base_blob<256U>.m_data._M_elems[0x15] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x15];
            id_00.super_base_blob<256U>.m_data._M_elems[0x16] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x16];
            id_00.super_base_blob<256U>.m_data._M_elems[0x17] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x17];
            id_00.super_base_blob<256U>.m_data._M_elems[0x18] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x18];
            id_00.super_base_blob<256U>.m_data._M_elems[0x19] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x19];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x1a];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x1b];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x1c];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x1d];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x1e];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 local_248.super_base_blob<256U>.m_data._M_elems[0x1f];
            AddActiveScriptPubKeyManWithDb(this,&local_300,id_00,type,bVar4);
          }
          std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::~vector(&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,
                            CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                     local_130.field_2._M_local_buf[0]) + 1);
          }
          std::
          _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
          ::~_Rb_tree(&local_228.tr_trees._M_t);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::~_Rb_tree(&local_228.keys._M_t);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::~_Rb_tree(&local_228.origins._M_t);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::~_Rb_tree(&local_228.pubkeys._M_t);
          std::
          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
          ::~_Rb_tree(&local_228.scripts._M_t);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 2);
      bVar4 = WalletBatch::TxnCommit(&local_300);
      if (bVar4) {
        if ((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
            local_300.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0
           ) {
          (*(*(_func_int ***)
              local_300.m_batch._M_t.
              super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
              .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_head_impl != &local_f8) {
          operator_delete(local_108._M_head_impl,local_f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_p != &local_48) {
          operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_b8._36_4_,local_b8._32_4_) != local_b8 + 0x30) {
          operator_delete((undefined1 *)CONCAT44(local_b8._36_4_,local_b8._32_4_),
                          CONCAT71(local_b8._49_7_,local_b8[0x30]) + 1);
        }
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
        }
        goto LAB_00c44bf6;
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar8,"Error: cannot commit db transaction for descriptors import");
    }
    else {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar8,"Error: cannot create db transaction for descriptors import");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_00c4542a:
  __stack_chk_fail();
}

Assistant:

void CWallet::SetupDescriptorScriptPubKeyMans()
{
    AssertLockHeld(cs_wallet);

    if (!IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
        // Make a seed
        CKey seed_key = GenerateRandomKey();
        CPubKey seed = seed_key.GetPubKey();
        assert(seed_key.VerifyPubKey(seed));

        // Get the extended key
        CExtKey master_key;
        master_key.SetSeed(seed_key);

        SetupDescriptorScriptPubKeyMans(master_key);
    } else {
        ExternalSigner signer = ExternalSignerScriptPubKeyMan::GetExternalSigner();

        // TODO: add account parameter
        int account = 0;
        UniValue signer_res = signer.GetDescriptors(account);

        if (!signer_res.isObject()) throw std::runtime_error(std::string(__func__) + ": Unexpected result");

        WalletBatch batch(GetDatabase());
        if (!batch.TxnBegin()) throw std::runtime_error("Error: cannot create db transaction for descriptors import");

        for (bool internal : {false, true}) {
            const UniValue& descriptor_vals = signer_res.find_value(internal ? "internal" : "receive");
            if (!descriptor_vals.isArray()) throw std::runtime_error(std::string(__func__) + ": Unexpected result");
            for (const UniValue& desc_val : descriptor_vals.get_array().getValues()) {
                const std::string& desc_str = desc_val.getValStr();
                FlatSigningProvider keys;
                std::string desc_error;
                auto descs = Parse(desc_str, keys, desc_error, false);
                if (descs.empty()) {
                    throw std::runtime_error(std::string(__func__) + ": Invalid descriptor \"" + desc_str + "\" (" + desc_error + ")");
                }
                auto& desc = descs.at(0);
                if (!desc->GetOutputType()) {
                    continue;
                }
                OutputType t =  *desc->GetOutputType();
                auto spk_manager = std::unique_ptr<ExternalSignerScriptPubKeyMan>(new ExternalSignerScriptPubKeyMan(*this, m_keypool_size));
                spk_manager->SetupDescriptor(batch, std::move(desc));
                uint256 id = spk_manager->GetID();
                AddScriptPubKeyMan(id, std::move(spk_manager));
                AddActiveScriptPubKeyManWithDb(batch, id, t, internal);
            }
        }

        // Ensure imported descriptors are committed to disk
        if (!batch.TxnCommit()) throw std::runtime_error("Error: cannot commit db transaction for descriptors import");
    }
}